

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall
OpenMD::HBondJump::processOverlapping(HBondJump *this,int frame,SelectionManager *sman)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  int aInd;
  int index;
  int hInd;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  int j;
  int i;
  Molecule *mol2;
  Molecule *mol1;
  reference in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff90;
  size_type __n;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Atom *local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  HBondDonor *local_40;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_38;
  undefined4 local_30;
  undefined4 local_2c;
  Molecule *local_28;
  Molecule *local_20;
  int local_c;
  
  local_c = in_ESI;
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  local_20 = SelectionManager::beginSelectedMolecule
                       ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                        (int *)in_stack_ffffffffffffff80._M_mask);
  while (local_20 != (Molecule *)0x0) {
    local_40 = Molecule::beginHBondDonor
                         ((Molecule *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (iterator *)in_stack_ffffffffffffff90._M_mask);
    while (local_40 != (HBondDonor *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xe40),(long)local_c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
      iVar1 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xe70),(long)local_c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
      in_stack_ffffffffffffffa4 = *pvVar3;
      local_30 = local_2c;
      local_28 = SelectionManager::nextSelectedMolecule
                           ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                            (int *)in_stack_ffffffffffffff80._M_mask);
      while (local_28 != (Molecule *)0x0) {
        local_50 = Molecule::beginHBondAcceptor
                             ((Molecule *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (iterator *)in_stack_ffffffffffffff90._M_mask);
        while (local_50 != (Atom *)0x0) {
          iVar1 = StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
          __n = in_stack_ffffffffffffff90._M_mask;
          if (iVar1 == in_stack_ffffffffffffffa4) {
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0xea0),(long)local_c);
            in_stack_ffffffffffffff90 =
                 std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__n);
            std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff90,true);
          }
          local_50 = Molecule::nextHBondAcceptor
                               ((Molecule *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (iterator *)in_stack_ffffffffffffff90._M_mask);
        }
        local_28 = SelectionManager::nextSelectedMolecule
                             ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                              (int *)in_stack_ffffffffffffff80._M_mask);
      }
      local_40 = Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (iterator *)in_stack_ffffffffffffff90._M_mask);
    }
    local_50 = Molecule::beginHBondAcceptor
                         ((Molecule *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (iterator *)in_stack_ffffffffffffff90._M_mask);
    while (local_50 != (Atom *)0x0) {
      in_stack_ffffffffffffffa4 = StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
      local_30 = local_2c;
      local_28 = SelectionManager::nextSelectedMolecule
                           ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                            (int *)in_stack_ffffffffffffff80._M_mask);
      while (local_28 != (Molecule *)0x0) {
        local_40 = Molecule::beginHBondDonor
                             ((Molecule *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (iterator *)in_stack_ffffffffffffff90._M_mask);
        while (local_40 != (HBondDonor *)0x0) {
          iVar1 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
          pvVar2 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0xe40),(long)local_c);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
          iVar1 = *pvVar3;
          pvVar2 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0xe70),(long)local_c);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
          if (*pvVar3 == in_stack_ffffffffffffffa4) {
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0xea0),(long)local_c);
            in_stack_ffffffffffffff80 =
                 std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff90._M_mask);
            std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff80,true);
          }
          local_40 = Molecule::nextHBondDonor
                               ((Molecule *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (iterator *)in_stack_ffffffffffffff90._M_mask);
        }
        local_28 = SelectionManager::nextSelectedMolecule
                             ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                              (int *)in_stack_ffffffffffffff80._M_mask);
      }
      local_50 = Molecule::nextHBondAcceptor
                           ((Molecule *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (iterator *)in_stack_ffffffffffffff90._M_mask);
    }
    local_20 = SelectionManager::nextSelectedMolecule
                         ((SelectionManager *)in_stack_ffffffffffffff90._M_p,
                          (int *)in_stack_ffffffffffffff80._M_mask);
  }
  return;
}

Assistant:

void HBondJump::processOverlapping(int frame, SelectionManager& sman) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;

    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (mol1 = sman.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman.nextSelectedMolecule(i)) {
      // loop over the possible donors in molecule 1:
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];
        aInd  = acceptor_[frame][index];

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aInd = hba->getGlobalIndex();

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd  = hbd->donatedHydrogen->getGlobalIndex();
            index = GIDtoH_[frame][hInd];

            if (acceptor_[frame][index] == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }